

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * statement(void)

{
  bool bVar1;
  treeNode *ptVar2;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  undefined1 local_92;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  undefined4 local_48;
  treeNode *local_38;
  treeNode *ret;
  string flag;
  
  std::__cxx11::string::string((string *)&ret,(string *)&nextToken.text);
  local_38 = (treeNode *)0x0;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret,
                          "if");
  if (bVar1) {
    flag.field_2._8_8_ = ifStmt();
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &ret,"read");
    if (bVar1) {
      flag.field_2._8_8_ = readStmt();
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ret,"print");
      if (bVar1) {
        flag.field_2._8_8_ = printStmt();
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_68,"continue",&local_69);
        bVar1 = match(&local_68,Empty);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator((allocator<char> *)&local_69);
        if (bVar1) {
          ptVar2 = (treeNode *)operator_new(0x58);
          local_92 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_90,"",&local_91);
          treeNode::treeNode(ptVar2,continueStmt,&local_90);
          local_92 = 0;
          flag.field_2._8_8_ = ptVar2;
          std::__cxx11::string::~string((string *)&local_90);
          std::allocator<char>::~allocator((allocator<char> *)&local_91);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_b8,"break",&local_b9);
          bVar1 = match(&local_b8,Empty);
          std::__cxx11::string::~string((string *)&local_b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
          if (bVar1) {
            ptVar2 = (treeNode *)operator_new(0x58);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_e0,"",&local_e1);
            treeNode::treeNode(ptVar2,breakStmt,&local_e0);
            flag.field_2._8_8_ = ptVar2;
            std::__cxx11::string::~string((string *)&local_e0);
            std::allocator<char>::~allocator((allocator<char> *)&local_e1);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&ret,"do");
            if (bVar1) {
              local_38 = doStmt();
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,anon_var_dwarf_6ffc + 0x15);
              if (bVar1) {
                flag.field_2._8_8_ = whileStmt();
                goto LAB_00114efd;
              }
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,"for");
              if (bVar1) {
                flag.field_2._8_8_ = forStmt();
                goto LAB_00114efd;
              }
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,";");
              if (bVar1) {
                flag.field_2._8_8_ = 0;
                goto LAB_00114efd;
              }
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret,"int");
              if ((((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&ret,"float"), bVar1)) ||
                  (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&ret,"char"), bVar1)) ||
                 (((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&ret,"string"), bVar1 ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&ret,"bool"), bVar1)) ||
                  (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&ret,"byte"), bVar1)))) {
                local_38 = declareStmt();
              }
              else {
                if (nextToken.kind != ID) {
                  flag.field_2._8_8_ = 0;
                  goto LAB_00114efd;
                }
                local_38 = assignStmt();
              }
            }
            flag.field_2._8_8_ = local_38;
          }
        }
      }
    }
  }
LAB_00114efd:
  local_48 = 1;
  std::__cxx11::string::~string((string *)&ret);
  return (treeNode *)flag.field_2._8_8_;
}

Assistant:

treeNode* statement()
{
    auto flag = nextToken.text;
    treeNode* ret=nullptr;
    if(flag=="if")
        return ifStmt();
    else if(flag=="read")
        return readStmt();
    else if(flag=="print")
        return printStmt();
    else if(match("continue"))
        return new treeNode(StmtKind::continueStmt,"");
    else if(match("break"))
        return new treeNode(StmtKind::breakStmt,"");
    else if(flag=="do")
        ret = doStmt();
    else if(flag=="while")
        return whileStmt();
    else if(flag=="for")
        return forStmt();
    else if(flag==";")
        return nullptr;
    else if(flag=="int"||flag=="float"||flag=="char"||flag=="string"||flag=="bool"||flag=="byte")
        ret = declareStmt();
    else if(nextToken.kind==Token::ID)
        ret = assignStmt();
    else 
        return nullptr;

    
    //match(";",Error::lackSem);
    return ret;
}